

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_mpi_io.c
# Opt level: O3

int kvtree_write_gather(char *prefix,kvtree *data,MPI_Comm comm)

{
  mode_t mVar1;
  int fd;
  size_t sVar2;
  kvtree *pkVar3;
  kvtree *recv_00;
  unsigned_long uVar4;
  ssize_t sVar5;
  MPI_Comm in_R8;
  MPI_Comm in_R9;
  int iVar6;
  int rank_world;
  int ranks_world;
  kvtree *recv;
  size_t bufsize;
  void *buf;
  kvtree *save;
  kvtree *send;
  int allranks;
  int writer;
  char mappath [1024];
  char mapfile [1024];
  uint local_870;
  int local_86c;
  kvtree *local_868;
  undefined8 local_860;
  undefined8 local_858;
  kvtree *local_850;
  kvtree *local_848;
  int local_840;
  uint local_83c;
  char local_838 [1024];
  char local_438 [1032];
  
  MPI_Comm_rank(comm,&local_870);
  MPI_Comm_size(comm,&local_86c);
  sVar2 = kvtree_pack_size(data);
  pick_writer((int)sVar2,(unsigned_long)&local_83c,&local_840,(int *)comm,in_R8);
  pkVar3 = kvtree_new();
  local_848 = pkVar3;
  recv_00 = kvtree_new();
  local_868 = recv_00;
  kvtree_exchange_sendq(pkVar3,local_83c,data);
  kvtree_exchange_direction(pkVar3,recv_00,comm,KVTREE_EXCHANGE_LEFT);
  pkVar3 = kvtree_new();
  local_850 = pkVar3;
  if (local_870 == local_83c) {
    kvtree_set(pkVar3,"RANK",recv_00);
    local_868 = (kvtree *)0x0;
  }
  kvtree_delete(&local_868);
  kvtree_delete(&local_848);
  snprintf(local_438,0x400,".0.%d",(ulong)local_83c);
  snprintf(local_838,0x400,"%s%s",prefix,local_438);
  uVar4 = kvtree_write_gather_map(prefix,local_438,1,(uint)(local_870 == local_83c),(int)comm,in_R9)
  ;
  iVar6 = (int)uVar4;
  if (local_870 == local_83c) {
    mVar1 = kvtree_getmode(1,1,0);
    fd = kvtree_open(local_838,0x241,(ulong)mVar1);
    if (fd < 0) {
      kvtree_err("Opening file for write: %s @ %s:%d",local_838,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi_io.c"
                 ,0x16a);
      iVar6 = 1;
    }
    else {
      kvtree_util_set_int(pkVar3,"LEVEL",0);
      kvtree_util_set_int(pkVar3,"RANKS",local_86c);
      kvtree_write_persist((void **)&local_858,&local_860,pkVar3);
      kvtree_lseek(local_838,fd,0,0);
      sVar5 = kvtree_write_attempt
                        (local_838,fd,(void *)CONCAT44(local_858._4_4_,(uint)local_858),
                         CONCAT44(local_860._4_4_,(int)local_860));
      if (sVar5 < 0) {
        iVar6 = 1;
      }
      kvtree_free(&local_858);
      kvtree_close(local_838,fd);
    }
  }
  kvtree_delete(&local_850);
  local_858._0_4_ = (uint)(iVar6 == 0);
  MPI_Allreduce(&local_858,&local_860,1,&ompi_mpi_int,&ompi_mpi_op_land,comm);
  return (int)((int)local_860 == 0);
}

Assistant:

int kvtree_write_gather(
  const char* prefix,
  kvtree* data,
  MPI_Comm comm)
{
  int rc = KVTREE_SUCCESS;

  /* get name of this process */
  int rank_world, ranks_world;
  MPI_Comm_rank(comm, &rank_world);
  MPI_Comm_size(comm, &ranks_world);

  /* pick our writer so that we send roughly 1MB of data to each */
  int writer, allranks;
  unsigned long pack_size = (unsigned long) kvtree_pack_size(data);
  pick_writer(1, pack_size, &writer, &allranks, comm);

  /* create send and receive hashes */
  kvtree* send = kvtree_new();
  kvtree* recv = kvtree_new();

  /* copy data into send hash */
  kvtree_exchange_sendq(send, writer, data);

  /* gather hashes to writers */
  kvtree_exchange_direction(send, recv, comm, KVTREE_EXCHANGE_LEFT);

  /* persist received hash */
  kvtree* save = kvtree_new();
  if (rank_world == writer) {
    /* record hash containing file names indexed by rank,
     * attach received hash to save hash and set recv to NULL
     * since we no longer need to free it */
    kvtree_set(save, "RANK", recv);
    recv = NULL;
  }

  /* free our hash data */
  kvtree_delete(&recv);
  kvtree_delete(&send);

  /* define file name */
  char mapfile[1024];
  char mappath[1024];
  snprintf(mapfile, sizeof(mapfile), ".0.%d", writer);
  snprintf(mappath, sizeof(mappath), "%s%s", prefix, mapfile);

  /* write map to files */
  unsigned long offset = 0;
  int level = 1;
  int valid = 0;
  if (rank_world == writer) {
    valid = 1;
  }
  if (kvtree_write_gather_map(prefix, mapfile, offset, level, valid, comm) != KVTREE_SUCCESS)
  {
    rc = KVTREE_FAILURE;
  }

  /* write blocks of summary data */
  if (rank_world == writer) {
    /* open the file if we need to */
    mode_t mode = kvtree_getmode(1, 1, 0);
    int fd = kvtree_open(mappath, O_WRONLY | O_CREAT | O_TRUNC, mode);
    if (fd >= 0) {
      /* store level value in hash */
      kvtree_util_set_int(save, "LEVEL", 0);

      /* record global number of ranks */
      kvtree_util_set_int(save, "RANKS", ranks_world);

      /* persist and compress hash */
      void* buf;
      size_t bufsize;
      kvtree_write_persist(&buf, &bufsize, save);

      /* write data to file */
      kvtree_lseek(mappath, fd, offset, SEEK_SET);
      ssize_t write_rc = kvtree_write_attempt(mappath, fd, buf, bufsize);
      if (write_rc < 0) {
        rc = KVTREE_FAILURE;
      }

      /* free memory */
      kvtree_free(&buf);

      /* close the file */
      kvtree_close(mappath, fd);
    } else {
      kvtree_err( "Opening file for write: %s @ %s:%d",
        mappath, __FILE__, __LINE__
      );
      rc = KVTREE_FAILURE;
    }
  }

  /* free the hash */
  kvtree_delete(&save);

  /* determine whether everyone wrote their files ok */
  if (kvtree_alltrue(rc == KVTREE_SUCCESS, comm)) {
    return KVTREE_SUCCESS;
  }
  return KVTREE_FAILURE;
}